

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerHeader.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::LayerHeader::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LayerHeader *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"LayerHeader:",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tLayer Number:        ",0x17);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tLayer Specific Info: ",0x17);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tLayer Length:        ",0x17);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString LayerHeader::GetAsString() const
{
    KStringStream ss;

    ss << "LayerHeader:"
       << "\n\tLayer Number:        " << ( KUINT16 )m_ui8LayerNumber
       << "\n\tLayer Specific Info: " << ( KUINT16 )m_ui8LayerSpecificInfo
       << "\n\tLayer Length:        " << m_ui16LayerLength
       << "\n";

    return ss.str();
}